

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O0

apx_clientSocketConnection_t * apx_clientSocketConnection_new(msocket_t *socket_object)

{
  apx_error_t aVar1;
  apx_clientSocketConnection_t *paStack_18;
  apx_error_t errorCode;
  apx_clientSocketConnection_t *self;
  msocket_t *socket_object_local;
  
  paStack_18 = (apx_clientSocketConnection_t *)malloc(0x488);
  if ((paStack_18 != (apx_clientSocketConnection_t *)0x0) &&
     (aVar1 = apx_clientSocketConnection_create(paStack_18,socket_object), aVar1 != 0)) {
    free(paStack_18);
    paStack_18 = (apx_clientSocketConnection_t *)0x0;
  }
  return paStack_18;
}

Assistant:

apx_clientSocketConnection_t *apx_clientSocketConnection_new(SOCKET_TYPE *socket_object)
{
   apx_clientSocketConnection_t *self = (apx_clientSocketConnection_t*) malloc(sizeof(apx_clientSocketConnection_t));
   if (self != 0)
   {
      apx_error_t errorCode = apx_clientSocketConnection_create(self, socket_object);
      if (errorCode != APX_NO_ERROR)
      {
         free(self);
         self = (apx_clientSocketConnection_t*) 0;
      }
   }
   return self;
}